

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O2

int aura_wait_status_timeout(aura_node *node,int status,timeval *timeout)

{
  aura_eventloop *loop;
  int local_3c;
  void *local_38;
  _func_void_aura_node_ptr_int_void_ptr *p_Stack_30;
  
  local_3c = status;
  loop = (aura_eventloop *)aura_node_eventloop_get_autocreate(node);
  local_38 = node->status_changed_arg;
  p_Stack_30 = node->status_changed_cb;
  node->status_changed_arg = &local_3c;
  node->status_changed_cb = wait_status_changed_cb;
  if (timeout != (timeval *)0x0) {
    aura_eventloop_loopexit(loop,timeout);
  }
  aura_eventloop_dispatch(loop,0);
  node->status_changed_arg = local_38;
  node->status_changed_cb = p_Stack_30;
  return node->status;
}

Assistant:

int aura_wait_status_timeout(struct aura_node *node, int status, struct timeval *timeout)
{
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);
	/* Save current callbacks/args */
	void *cb = node->status_changed_cb;
	void *arg = node->status_changed_arg;
	aura_status_changed_cb(node, wait_status_changed_cb, &status);
	if (timeout)
		aura_eventloop_loopexit(loop, timeout);
	aura_eventloop_dispatch(loop, 0);
	/* restore user callback, if any */
	aura_status_changed_cb(node, cb, arg);
	return aura_get_status(node);
}